

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  int *piVar4;
  byte bVar5;
  stbi_uc sVar6;
  int iVar7;
  stbi__uint32 sVar8;
  int iVar9;
  int iVar10;
  stbi__jpeg *z;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  code *pcVar14;
  undefined8 *puVar15;
  int iVar16;
  long lVar17;
  undefined8 *puVar18;
  char *pcVar19;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *paVar23;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 uVar24;
  stbi_uc *extraout_RDX_16;
  stbi_uc *extraout_RDX_17;
  stbi_uc *psVar25;
  stbi__context *psVar26;
  stbi_uc **ppsVar27;
  undefined1 *puVar28;
  byte *pbVar29;
  ulong uVar30;
  short *psVar31;
  stbi_uc *psVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  short sVar40;
  stbi__huffman *psVar41;
  long *in_FS_OFFSET;
  bool bVar42;
  undefined1 auVar43 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1c4;
  ulong local_190;
  stbi_uc *local_158 [4];
  int local_138;
  int local_134;
  int *local_130;
  anon_struct_96_18_0d0905d3 *local_128;
  long local_120;
  stbi__uint32 *local_118;
  int *local_110;
  stbi__huffman *local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_100 = (stbi__uint32 *)x;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    pvVar13 = (void *)0x0;
  }
  else {
    z->s = s;
    z->idct_block_kernel = stbi__idct_simd;
    z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = z->img_comp;
      lVar11 = 0x46d8;
      do {
        psVar25 = z->huff_dc[0].fast + lVar11 + -8;
        psVar25[0] = '\0';
        psVar25[1] = '\0';
        psVar25[2] = '\0';
        psVar25[3] = '\0';
        psVar25[4] = '\0';
        psVar25[5] = '\0';
        psVar25[6] = '\0';
        psVar25[7] = '\0';
        psVar25[8] = '\0';
        psVar25[9] = '\0';
        psVar25[10] = '\0';
        psVar25[0xb] = '\0';
        psVar25[0xc] = '\0';
        psVar25[0xd] = '\0';
        psVar25[0xe] = '\0';
        psVar25[0xf] = '\0';
        lVar11 = lVar11 + 0x60;
      } while (lVar11 != 0x4858);
      z->restart_interval = 0;
      local_118 = (stbi__uint32 *)y;
      local_110 = comp;
      iVar7 = stbi__decode_jpeg_header(z,0);
      uVar37 = extraout_EDX;
      if (iVar7 != 0) {
        bVar5 = stbi__get_marker(z);
        puVar15 = (undefined8 *)(*in_FS_OFFSET + -0x20);
        local_130 = z->huff_ac[0].delta + 9;
        uVar24 = extraout_RDX;
LAB_001ba26c:
        uVar37 = (uint)uVar24;
        if (bVar5 != 0xda) {
          uVar35 = (uint)bVar5;
          if (uVar35 == 0xdc) {
            iVar7 = stbi__get16be(z->s);
            sVar8 = stbi__get16be(z->s);
            paVar23 = extraout_RDX_00;
            if (iVar7 == 4) {
              if (sVar8 == z->s->img_y) goto LAB_001bb5b8;
              pcVar19 = "bad DNL height";
            }
            else {
              pcVar19 = "bad DNL len";
            }
            goto LAB_001bc055;
          }
          if (uVar35 == 0xd9) {
            if ((z->progressive != 0) && (0 < z->s->img_n)) {
              lVar11 = 0;
              do {
                iVar7 = z->img_comp[lVar11].y + 7 >> 3;
                if (0 < iVar7) {
                  uVar37 = paVar1[lVar11].x + 7 >> 3;
                  iVar38 = 0;
                  do {
                    if (0 < (int)uVar37) {
                      uVar39 = 0;
                      do {
                        psVar31 = paVar1[lVar11].coeff +
                                  (paVar1[lVar11].coeff_w * iVar38 + (int)uVar39) * 0x40;
                        iVar34 = paVar1[lVar11].tq;
                        lVar17 = 0;
                        do {
                          psVar31[lVar17] = psVar31[lVar17] * z->dequant[iVar34][lVar17];
                          lVar17 = lVar17 + 1;
                        } while (lVar17 != 0x40);
                        (*z->idct_block_kernel)
                                  (paVar1[lVar11].data +
                                   uVar39 * 8 + (long)(iVar38 * 8 * paVar1[lVar11].w2),
                                   paVar1[lVar11].w2,psVar31);
                        uVar39 = uVar39 + 1;
                        uVar24 = extraout_RDX_15;
                      } while (uVar39 != uVar37);
                    }
                    iVar38 = iVar38 + 1;
                  } while (iVar38 != iVar7);
                }
                uVar37 = (uint)uVar24;
                lVar11 = lVar11 + 1;
              } while (lVar11 < z->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
            }
            uVar35 = z->s->img_n;
            if (uVar35 == 3) {
              bVar42 = true;
              if (z->rgb != 3) {
                if (z->app14_color_transform != 0) goto LAB_001bb7de;
                bVar42 = z->jfif == 0;
              }
            }
            else {
LAB_001bb7de:
              bVar42 = false;
            }
            uVar22 = 1;
            if (bVar42) {
              uVar22 = uVar35;
            }
            if (2 < req_comp) {
              uVar22 = uVar35;
            }
            if (uVar35 != 3) {
              uVar22 = uVar35;
            }
            if ((int)uVar22 < 1) goto LAB_001bc064;
            local_158[2] = (stbi_uc *)0x0;
            local_158[3] = (stbi_uc *)0x0;
            local_158[0] = (stbi_uc *)0x0;
            local_158[1] = (stbi_uc *)0x0;
            lVar11 = 0;
            do {
              psVar26 = z->s;
              pvVar13 = malloc((ulong)(psVar26->img_x + 3));
              *(void **)((long)&z->img_comp[0].linebuf + lVar11 * 2) = pvVar13;
              if (pvVar13 == (void *)0x0) {
                stbi__free_jpeg_components(z,psVar26->img_n,why);
                *puVar15 = "outofmem";
              }
              else {
                uVar39 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar11 * 2);
                iVar7 = (int)uVar39;
                *(int *)((long)local_e0 + lVar11) = iVar7;
                iVar38 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar11 * 2);
                *(int *)((long)local_e0 + lVar11 + 4) = iVar38;
                *(int *)((long)local_e0 + lVar11 + 0xc) = iVar38 >> 1;
                *(int *)((long)local_e0 + lVar11 + 8) =
                     (int)((ulong)((psVar26->img_x + iVar7) - 1) / (uVar39 & 0xffffffff));
                *(undefined4 *)((long)local_e0 + lVar11 + 0x10) = 0;
                uVar24 = *(undefined8 *)((long)&z->img_comp[0].data + lVar11 * 2);
                *(undefined8 *)((long)local_f0 + lVar11 + 8) = uVar24;
                *(undefined8 *)((long)local_f0 + lVar11) = uVar24;
                if ((iVar7 == 1) && (iVar38 == 1)) {
                  pcVar14 = resample_row_1;
                }
                else if ((iVar7 == 1) && (iVar38 == 2)) {
                  pcVar14 = stbi__resample_row_v_2;
                }
                else if ((iVar7 == 2) && (iVar38 == 1)) {
                  pcVar14 = stbi__resample_row_h_2;
                }
                else if ((iVar7 == 2) && (iVar38 == 2)) {
                  pcVar14 = z->resample_row_hv_2_kernel;
                }
                else {
                  pcVar14 = stbi__resample_row_generic;
                }
                *(code **)((long)local_f8 + lVar11) = pcVar14;
              }
              if (pvVar13 == (void *)0x0) goto LAB_001bc06c;
              lVar11 = lVar11 + 0x30;
            } while ((ulong)uVar22 * 0x30 != lVar11);
            psVar26 = z->s;
            sVar8 = psVar26->img_y;
            pvVar13 = stbi__malloc_mad3(req_comp,psVar26->img_x,sVar8,1);
            if (pvVar13 == (void *)0x0) {
              stbi__free_jpeg_components(z,psVar26->img_n,why_00);
              *puVar15 = "outofmem";
              pvVar13 = (void *)0x0;
            }
            else {
              iVar7 = why_00;
              if (sVar8 != 0) {
                iVar38 = 0;
                uVar37 = 0;
                do {
                  sVar8 = psVar26->img_x;
                  ppsVar27 = local_158;
                  lVar11 = 0;
                  do {
                    puVar15 = (undefined8 *)((long)local_f0 + lVar11 + 8);
                    iVar7 = *(int *)((long)local_e0 + lVar11 + 0xc);
                    iVar34 = *(int *)((long)local_e0 + lVar11 + 4);
                    iVar16 = iVar34 >> 1;
                    puVar18 = puVar15;
                    if (iVar7 < iVar16) {
                      puVar18 = (undefined8 *)((long)local_f0 + lVar11);
                    }
                    if (iVar16 <= iVar7) {
                      puVar15 = (undefined8 *)((long)local_f0 + lVar11);
                    }
                    auVar43 = (**(code **)((long)local_f8 + lVar11))
                                        (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar11 * 2)
                                         ,*puVar18,*puVar15,
                                         *(undefined4 *)((long)local_e0 + lVar11 + 8));
                    psVar25 = auVar43._8_8_;
                    *ppsVar27 = auVar43._0_8_;
                    *(int *)((long)local_e0 + lVar11 + 0xc) = iVar7 + 1;
                    if (iVar34 <= iVar7 + 1) {
                      *(undefined4 *)((long)local_e0 + lVar11 + 0xc) = 0;
                      lVar17 = *(long *)((long)local_f0 + lVar11 + 8);
                      *(long *)((long)local_f0 + lVar11) = lVar17;
                      iVar7 = *(int *)((long)local_e0 + lVar11 + 0x10) + 1;
                      *(int *)((long)local_e0 + lVar11 + 0x10) = iVar7;
                      if (iVar7 < *(int *)((long)&z->img_comp[0].y + lVar11 * 2)) {
                        *(long *)((long)local_f0 + lVar11 + 8) =
                             lVar17 + *(int *)((long)&z->img_comp[0].w2 + lVar11 * 2);
                      }
                    }
                    lVar11 = lVar11 + 0x30;
                    ppsVar27 = ppsVar27 + 1;
                  } while ((ulong)uVar22 * 0x30 != lVar11);
                  if (req_comp < 3) {
                    psVar26 = z->s;
                    if (bVar42) {
                      if (req_comp == 1) {
                        if (psVar26->img_x != 0) {
                          uVar39 = 0;
                          do {
                            bVar5 = local_158[2][uVar39];
                            *(char *)((long)pvVar13 + uVar39 + sVar8 * iVar38) =
                                 (char)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                                        (uint)local_158[1][uVar39] * 0x96 +
                                        (uint)local_158[0][uVar39] * 0x4d >> 8);
                            uVar39 = uVar39 + 1;
                            psVar25 = local_158[1];
                          } while (uVar39 < psVar26->img_x);
                        }
                      }
                      else if (psVar26->img_x != 0) {
                        uVar39 = 0;
                        do {
                          bVar5 = local_158[2][uVar39];
                          *(char *)((long)pvVar13 + uVar39 * 2 + (ulong)(sVar8 * iVar38)) =
                               (char)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                                      (uint)local_158[1][uVar39] * 0x96 +
                                      (uint)local_158[0][uVar39] * 0x4d >> 8);
                          *(undefined1 *)((long)pvVar13 + uVar39 * 2 + (ulong)(sVar8 * iVar38) + 1)
                               = 0xff;
                          uVar39 = uVar39 + 1;
                          psVar25 = local_158[1];
                        } while (uVar39 < psVar26->img_x);
                      }
                    }
                    else if (psVar26->img_n == 4) {
                      if (z->app14_color_transform == 2) {
                        if (psVar26->img_x != 0) {
                          puVar28 = (undefined1 *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 1);
                          uVar39 = 0;
                          do {
                            iVar7 = (local_158[0][uVar39] ^ 0xff) * (uint)local_158[3][uVar39];
                            puVar28[-1] = (char)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            *puVar28 = 0xff;
                            uVar39 = uVar39 + 1;
                            puVar28 = puVar28 + (uint)req_comp;
                            psVar25 = local_158[3];
                          } while (uVar39 < psVar26->img_x);
                        }
                      }
                      else {
                        if (z->app14_color_transform != 0) goto LAB_001bbdc8;
                        if (psVar26->img_x != 0) {
                          puVar28 = (undefined1 *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 1);
                          uVar39 = 0;
                          do {
                            bVar5 = local_158[3][uVar39];
                            iVar7 = (uint)local_158[0][uVar39] * (uint)bVar5;
                            iVar34 = (uint)local_158[1][uVar39] * (uint)bVar5;
                            puVar28[-1] = (char)(((uint)local_158[2][uVar39] * (uint)bVar5 +
                                                  ((uint)local_158[2][uVar39] * (uint)bVar5 + 0x80
                                                  >> 8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                 (iVar34 + (iVar34 + 0x80U >> 8) + 0x80 >> 8 & 0xff)
                                                 * 0x96 + (iVar7 + (iVar7 + 0x80U >> 8) + 0x80 >> 8
                                                          & 0xff) * 0x4d >> 8);
                            *puVar28 = 0xff;
                            uVar39 = uVar39 + 1;
                            puVar28 = puVar28 + (uint)req_comp;
                            psVar25 = local_158[0];
                          } while (uVar39 < psVar26->img_x);
                        }
                      }
                    }
                    else {
LAB_001bbdc8:
                      uVar35 = psVar26->img_x;
                      psVar25 = (stbi_uc *)(ulong)uVar35;
                      if (req_comp == 1) {
                        if (uVar35 != 0) {
                          psVar25 = (stbi_uc *)0x0;
                          do {
                            psVar25[(ulong)(sVar8 * iVar38) + (long)pvVar13] =
                                 local_158[0][(long)psVar25];
                            psVar25 = psVar25 + 1;
                          } while (psVar25 < (stbi_uc *)(ulong)psVar26->img_x);
                        }
                      }
                      else if (uVar35 != 0) {
                        psVar25 = (stbi_uc *)0x0;
                        do {
                          *(stbi_uc *)((long)pvVar13 + (long)psVar25 * 2 + (ulong)(sVar8 * iVar38))
                               = local_158[0][(long)psVar25];
                          *(undefined1 *)
                           ((long)pvVar13 + (long)psVar25 * 2 + (ulong)(sVar8 * iVar38) + 1) = 0xff;
                          psVar25 = psVar25 + 1;
                        } while (psVar25 < (stbi_uc *)(ulong)psVar26->img_x);
                      }
                    }
                  }
                  else {
                    psVar32 = (stbi_uc *)((ulong)(uVar37 * req_comp * sVar8) + (long)pvVar13);
                    psVar26 = z->s;
                    if (psVar26->img_n == 3) {
                      if (bVar42) {
                        if (psVar26->img_x != 0) {
                          puVar28 = (undefined1 *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 3);
                          uVar39 = 0;
                          do {
                            puVar28[-3] = local_158[0][uVar39];
                            puVar28[-2] = local_158[1][uVar39];
                            puVar28[-1] = local_158[2][uVar39];
                            *puVar28 = 0xff;
                            uVar39 = uVar39 + 1;
                            puVar28 = puVar28 + (uint)req_comp;
                            psVar25 = local_158[2];
                          } while (uVar39 < psVar26->img_x);
                        }
                      }
                      else {
LAB_001bbe3b:
                        (*z->YCbCr_to_RGB_kernel)
                                  (psVar32,local_158[0],local_158[1],local_158[2],psVar26->img_x,
                                   req_comp);
                        psVar25 = extraout_RDX_16;
                      }
                    }
                    else if (psVar26->img_n == 4) {
                      if (z->app14_color_transform == 2) {
                        (*z->YCbCr_to_RGB_kernel)
                                  (psVar32,local_158[0],local_158[1],local_158[2],psVar26->img_x,
                                   req_comp);
                        psVar26 = z->s;
                        psVar25 = extraout_RDX_17;
                        if (psVar26->img_x != 0) {
                          pbVar29 = (byte *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 2);
                          psVar25 = (stbi_uc *)0x0;
                          do {
                            bVar5 = local_158[3][(long)psVar25];
                            iVar7 = (pbVar29[-2] ^ 0xff) * (uint)bVar5;
                            pbVar29[-2] = (byte)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            iVar7 = (pbVar29[-1] ^ 0xff) * (uint)bVar5;
                            pbVar29[-1] = (byte)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            iVar7 = (*pbVar29 ^ 0xff) * (uint)bVar5;
                            *pbVar29 = (byte)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            psVar25 = psVar25 + 1;
                            pbVar29 = pbVar29 + (uint)req_comp;
                          } while (psVar25 < (stbi_uc *)(ulong)psVar26->img_x);
                        }
                      }
                      else {
                        if (z->app14_color_transform != 0) goto LAB_001bbe3b;
                        if (psVar26->img_x != 0) {
                          puVar28 = (undefined1 *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 3);
                          uVar39 = 0;
                          do {
                            bVar5 = local_158[3][uVar39];
                            iVar7 = (uint)local_158[0][uVar39] * (uint)bVar5;
                            puVar28[-3] = (char)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            iVar7 = (uint)local_158[1][uVar39] * (uint)bVar5;
                            puVar28[-2] = (char)((iVar7 + 0x80U >> 8) + iVar7 + 0x80 >> 8);
                            puVar28[-1] = (char)(((uint)local_158[2][uVar39] * (uint)bVar5 + 0x80 >>
                                                 8) + (uint)local_158[2][uVar39] * (uint)bVar5 +
                                                 0x80 >> 8);
                            *puVar28 = 0xff;
                            uVar39 = uVar39 + 1;
                            puVar28 = puVar28 + (uint)req_comp;
                            psVar25 = local_158[1];
                          } while (uVar39 < psVar26->img_x);
                        }
                      }
                    }
                    else if (psVar26->img_x != 0) {
                      puVar28 = (undefined1 *)((long)pvVar13 + (ulong)(sVar8 * iVar38) + 3);
                      psVar32 = (stbi_uc *)0x0;
                      do {
                        sVar6 = local_158[0][(long)psVar32];
                        puVar28[-1] = sVar6;
                        puVar28[-2] = sVar6;
                        puVar28[-3] = sVar6;
                        *puVar28 = 0xff;
                        psVar32 = psVar32 + 1;
                        psVar25 = (stbi_uc *)(ulong)psVar26->img_x;
                        puVar28 = puVar28 + (uint)req_comp;
                      } while (psVar32 < psVar25);
                    }
                  }
                  iVar7 = (int)psVar25;
                  uVar37 = uVar37 + 1;
                  psVar26 = z->s;
                  iVar38 = iVar38 + req_comp;
                } while (uVar37 < psVar26->img_y);
              }
              stbi__free_jpeg_components(z,psVar26->img_n,iVar7);
              psVar26 = z->s;
              *local_100 = psVar26->img_x;
              *local_118 = psVar26->img_y;
              if (local_110 != (int *)0x0) {
                *local_110 = (uint)(2 < psVar26->img_n) * 2 + 1;
              }
            }
            goto LAB_001bc06e;
          }
          iVar7 = stbi__process_marker(z,uVar35);
          uVar37 = extraout_EDX_00;
          if (iVar7 != 0) goto LAB_001bb5b8;
          goto LAB_001bc05d;
        }
        iVar7 = stbi__get16be(z->s);
        psVar26 = z->s;
        pbVar29 = psVar26->img_buffer;
        paVar23 = extraout_RDX_01;
        if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba308:
          psVar26->img_buffer = pbVar29 + 1;
          bVar5 = *pbVar29;
        }
        else {
          if (psVar26->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar26);
            pbVar29 = psVar26->img_buffer;
            paVar23 = extraout_RDX_02;
            goto LAB_001ba308;
          }
          bVar5 = 0;
        }
        z->scan_n = (uint)bVar5;
        if (((byte)(bVar5 - 5) < 0xfc) || (z->s->img_n < (int)(uint)bVar5)) {
          pcVar19 = "bad SOS component count";
        }
        else {
          if (iVar7 == (uint)bVar5 * 2 + 6) {
            if (bVar5 != 0) {
              lVar11 = 0;
              do {
                psVar26 = z->s;
                pbVar29 = psVar26->img_buffer;
                if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba382:
                  psVar26->img_buffer = pbVar29 + 1;
                  uVar35 = (uint)*pbVar29;
                }
                else {
                  if (psVar26->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar26);
                    pbVar29 = psVar26->img_buffer;
                    goto LAB_001ba382;
                  }
                  uVar35 = 0;
                }
                psVar26 = z->s;
                pbVar29 = psVar26->img_buffer;
                if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba3be:
                  psVar26->img_buffer = pbVar29 + 1;
                  bVar5 = *pbVar29;
                }
                else {
                  if (psVar26->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar26);
                    pbVar29 = psVar26->img_buffer;
                    goto LAB_001ba3be;
                  }
                  bVar5 = 0;
                }
                uVar37 = z->s->img_n;
                if ((int)uVar37 < 1) {
                  uVar39 = 0;
                }
                else {
                  uVar39 = 0;
                  paVar23 = paVar1;
                  do {
                    if (paVar23->id == uVar35) goto LAB_001ba3f1;
                    uVar39 = uVar39 + 1;
                    paVar23 = paVar23 + 1;
                  } while (uVar37 != uVar39);
                  uVar39 = (ulong)uVar37;
                }
LAB_001ba3f1:
                if ((uint)uVar39 == uVar37) goto LAB_001bc05d;
                uVar30 = uVar39 & 0xffffffff;
                paVar23 = (anon_struct_96_18_0d0905d3 *)(uVar30 * 0x60);
                z->img_comp[uVar30].hd = (uint)(bVar5 >> 4);
                if (0x3f < bVar5) {
                  pcVar19 = "bad DC huff";
                  goto LAB_001bc055;
                }
                paVar23 = paVar1 + uVar30;
                paVar23->ha = bVar5 & 0xf;
                if (3 < (bVar5 & 0xf)) {
                  pcVar19 = "bad AC huff";
                  goto LAB_001bc055;
                }
                z->order[lVar11] = (uint)uVar39;
                lVar11 = lVar11 + 1;
              } while (lVar11 < z->scan_n);
            }
            psVar26 = z->s;
            pbVar29 = psVar26->img_buffer;
            if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba485:
              psVar26->img_buffer = pbVar29 + 1;
              uVar37 = (uint)*pbVar29;
            }
            else {
              if (psVar26->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar26);
                pbVar29 = psVar26->img_buffer;
                goto LAB_001ba485;
              }
              uVar37 = 0;
            }
            z->spec_start = uVar37;
            psVar26 = z->s;
            pbVar29 = psVar26->img_buffer;
            if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba4c9:
              psVar26->img_buffer = pbVar29 + 1;
              uVar37 = (uint)*pbVar29;
            }
            else {
              if (psVar26->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar26);
                pbVar29 = psVar26->img_buffer;
                goto LAB_001ba4c9;
              }
              uVar37 = 0;
            }
            z->spec_end = uVar37;
            psVar26 = z->s;
            pbVar29 = psVar26->img_buffer;
            if (pbVar29 < psVar26->img_buffer_end) {
LAB_001ba50d:
              psVar26->img_buffer = pbVar29 + 1;
              bVar5 = *pbVar29;
            }
            else {
              if (psVar26->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar26);
                pbVar29 = psVar26->img_buffer;
                goto LAB_001ba50d;
              }
              bVar5 = 0;
            }
            z->succ_high = (uint)(bVar5 >> 4);
            uVar37 = bVar5 & 0xf;
            paVar23 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar37;
            z->succ_low = uVar37;
            iVar7 = z->progressive;
            iVar38 = z->spec_start;
            if (iVar7 == 0) {
              if (((iVar38 != 0) || (0xf < bVar5)) || ((bVar5 & 0xf) != 0)) goto LAB_001bb69a;
              z->spec_end = 0x3f;
            }
            else if (((0x3f < iVar38) || (0x3f < z->spec_end)) ||
                    ((z->spec_end < iVar38 || ((0xdf < bVar5 || (0xd < uVar37)))))) {
LAB_001bb69a:
              pcVar19 = "bad SOS";
              goto LAB_001bc055;
            }
            iVar38 = z->scan_n;
            uVar39 = (ulong)(uint)z->restart_interval;
            if (z->restart_interval == 0) {
              uVar39 = 0x7fffffff;
            }
            z->code_buffer = 0;
            z->code_bits = 0;
            z->nomore = 0;
            z->img_comp[3].dc_pred = 0;
            z->img_comp[2].dc_pred = 0;
            z->img_comp[1].dc_pred = 0;
            z->img_comp[0].dc_pred = 0;
            z->marker = 0xff;
            uVar37 = (uint)uVar39;
            z->todo = uVar37;
            z->eob_run = 0;
            if (iVar7 == 0) {
              if (iVar38 == 1) {
                iVar38 = z->order[0];
                iVar34 = z->img_comp[iVar38].y + 7 >> 3;
                if (0 < iVar34) {
                  uVar35 = paVar1[iVar38].x + 7 >> 3;
                  local_190 = (ulong)uVar35;
                  iVar9 = 0;
                  iVar16 = 0;
                  do {
                    if (0 < (int)uVar35) {
                      lVar11 = 0;
                      do {
                        iVar7 = stbi__jpeg_decode_block
                                          (z,local_f8,z->huff_dc + paVar1[iVar38].hd,
                                           z->huff_ac + paVar1[iVar38].ha,
                                           z->fast_ac[paVar1[iVar38].ha],iVar38,
                                           z->dequant[paVar1[iVar38].tq]);
                        if (iVar7 == 0) {
                          bVar42 = false;
                          local_1c4 = 0;
                          uVar39 = extraout_RDX_08;
                        }
                        else {
                          (*z->idct_block_kernel)
                                    (paVar1[iVar38].data + lVar11 + iVar9 * paVar1[iVar38].w2,
                                     paVar1[iVar38].w2,local_f8);
                          iVar7 = z->todo;
                          z->todo = iVar7 + -1;
                          bVar42 = true;
                          uVar39 = extraout_RDX_09;
                          if (iVar7 < 2) {
                            if (z->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(z);
                              uVar39 = extraout_RDX_10;
                            }
                            if ((z->marker & 0xf8) == 0xd0) {
                              z->code_buffer = 0;
                              z->code_bits = 0;
                              z->nomore = 0;
                              z->img_comp[3].dc_pred = 0;
                              z->img_comp[2].dc_pred = 0;
                              z->img_comp[1].dc_pred = 0;
                              z->img_comp[0].dc_pred = 0;
                              z->marker = 0xff;
                              iVar7 = z->restart_interval;
                              uVar39 = 0x7fffffff;
                              if (iVar7 == 0) {
                                iVar7 = 0x7fffffff;
                              }
                              z->todo = iVar7;
                              z->eob_run = 0;
                            }
                            else {
                              local_1c4 = 1;
                              bVar42 = false;
                            }
                          }
                        }
                        uVar37 = (uint)uVar39;
                        iVar7 = local_1c4;
                        if (!bVar42) goto LAB_001bb5a4;
                        lVar11 = lVar11 + 8;
                      } while (local_190 * 8 != lVar11);
                    }
                    uVar37 = (uint)uVar39;
                    iVar16 = iVar16 + 1;
                    iVar9 = iVar9 + 8;
                  } while (iVar16 != iVar34);
                }
LAB_001bb304:
                iVar7 = 1;
              }
              else {
                iVar7 = 1;
                if (0 < z->img_mcu_y) {
                  iVar38 = 0;
                  do {
                    if (0 < z->img_mcu_x) {
                      local_1c4 = 0;
                      do {
                        if (0 < z->scan_n) {
                          lVar11 = 0;
                          do {
                            iVar7 = z->order[lVar11];
                            if (0 < z->img_comp[iVar7].v) {
                              iVar34 = 0;
                              bVar42 = true;
                              do {
                                local_190 = CONCAT71(local_190._1_7_,bVar42);
                                iVar16 = paVar1[iVar7].h;
                                if (0 < iVar16) {
                                  iVar9 = 0;
                                  do {
                                    iVar36 = paVar1[iVar7].v;
                                    iVar10 = stbi__jpeg_decode_block
                                                       (z,local_f8,z->huff_dc + paVar1[iVar7].hd,
                                                        z->huff_ac + paVar1[iVar7].ha,
                                                        z->fast_ac[paVar1[iVar7].ha],iVar7,
                                                        z->dequant[paVar1[iVar7].tq]);
                                    uVar37 = (uint)extraout_RDX_12;
                                    if (iVar10 == 0) {
                                      uVar39 = extraout_RDX_12;
                                      if (bVar42 == false) goto LAB_001bb484;
                                      goto LAB_001bb589;
                                    }
                                    (*z->idct_block_kernel)
                                              (paVar1[iVar7].data +
                                               (long)((iVar16 * local_1c4 + iVar9) * 8) +
                                               (long)((iVar36 * iVar38 + iVar34) * paVar1[iVar7].w2
                                                     * 8),paVar1[iVar7].w2,local_f8);
                                    iVar9 = iVar9 + 1;
                                    iVar16 = paVar1[iVar7].h;
                                    uVar39 = extraout_RDX_13;
                                  } while (iVar9 < iVar16);
                                }
                                iVar34 = iVar34 + 1;
                                bVar42 = iVar34 < paVar1[iVar7].v;
                              } while (iVar34 < paVar1[iVar7].v);
                            }
LAB_001bb484:
                            lVar11 = lVar11 + 1;
                          } while (lVar11 < z->scan_n);
                        }
                        uVar37 = (uint)uVar39;
                        iVar34 = z->todo;
                        z->todo = iVar34 + -1;
                        iVar7 = 1;
                        if (iVar34 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar37 = extraout_EDX_02;
                          }
                          if ((z->marker & 0xf8) != 0xd0) goto LAB_001bb5a4;
                          z->code_buffer = 0;
                          z->code_bits = 0;
                          z->nomore = 0;
                          z->img_comp[3].dc_pred = 0;
                          z->img_comp[2].dc_pred = 0;
                          z->img_comp[1].dc_pred = 0;
                          z->img_comp[0].dc_pred = 0;
                          z->marker = 0xff;
                          iVar7 = z->restart_interval;
                          uVar39 = 0x7fffffff;
                          if (iVar7 == 0) {
                            iVar7 = 0x7fffffff;
                          }
                          z->todo = iVar7;
                          z->eob_run = 0;
                        }
                        local_1c4 = local_1c4 + 1;
                      } while (local_1c4 < z->img_mcu_x);
                    }
                    uVar37 = (uint)uVar39;
                    iVar7 = 1;
                    iVar38 = iVar38 + 1;
                  } while (iVar38 < z->img_mcu_y);
                }
              }
            }
            else if (iVar38 == 1) {
              local_120 = (long)z->order[0];
              local_134 = z->img_comp[local_120].y + 7 >> 3;
              iVar7 = 1;
              if (0 < local_134) {
                paVar23 = paVar1 + local_120;
                local_138 = z->img_comp[local_120].x + 7 >> 3;
                iVar38 = 0;
                local_128 = paVar23;
                do {
                  if (0 < local_138) {
                    iVar7 = 0;
                    do {
                      piVar4 = local_130;
                      psVar31 = paVar23->coeff + (paVar23->coeff_w * iVar38 + iVar7) * 0x40;
                      uVar30 = (ulong)z->spec_start;
                      if (uVar30 == 0) {
                        iVar34 = stbi__jpeg_decode_block_prog_dc
                                           (z,psVar31,z->huff_dc + paVar23->hd,(int)local_120);
                        uVar39 = extraout_RDX_04;
                        if (iVar34 != 0) goto LAB_001bab57;
                        bVar42 = false;
                        local_190 = 0;
                      }
                      else {
                        lVar11 = (long)paVar23->ha;
                        psVar41 = z->huff_ac + lVar11;
                        local_1c4 = z->succ_low;
                        iVar34 = z->eob_run;
                        bVar5 = (byte)local_1c4;
                        if (z->succ_high == 0) {
                          if (iVar34 == 0) {
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              sVar40 = z->fast_ac[lVar11][z->code_buffer >> 0x17];
                              uVar37 = (uint)sVar40;
                              iVar34 = (int)uVar30;
                              if (sVar40 == 0) {
                                if (z->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                uVar37 = z->code_buffer;
                                uVar12 = (ulong)uVar37;
                                uVar39 = (ulong)psVar41->fast[uVar37 >> 0x17];
                                if (uVar39 == 0xff) {
                                  lVar17 = 0;
                                  do {
                                    lVar33 = lVar17;
                                    lVar17 = lVar33 + 1;
                                  } while ((uint)piVar4[lVar11 * 0x1a4 + lVar33 + -0x11] <=
                                           uVar37 >> 0x10);
                                  iVar16 = z->code_bits;
                                  if (lVar17 == 8) {
                                    z->code_bits = iVar16 + -0x10;
                                    uVar35 = 0xffffffff;
                                  }
                                  else {
                                    uVar35 = 0xffffffff;
                                    if ((int)(lVar33 + 10) <= iVar16) {
                                      uVar35 = stbi__bmask[lVar33 + 10];
                                      iVar9 = piVar4[lVar11 * 0x1a4 + lVar17];
                                      uVar22 = uVar37 << ((byte)(lVar33 + 10) & 0x1f);
                                      z->code_bits = (iVar16 - (int)lVar17) + -9;
                                      z->code_buffer = uVar22;
                                      uVar39 = (ulong)(int)((uVar37 >> (0x17U - (char)lVar17 & 0x1f)
                                                            & uVar35) + iVar9);
                                      goto LAB_001badb6;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar41->size[uVar39];
                                  uVar35 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= z->code_bits) {
                                    uVar22 = uVar37 << (bVar2 & 0x1f);
                                    z->code_buffer = uVar22;
                                    z->code_bits = z->code_bits - (uint)bVar2;
LAB_001badb6:
                                    uVar12 = (ulong)uVar22;
                                    uVar35 = (uint)psVar41->values[uVar39];
                                  }
                                }
                                if ((int)uVar35 < 0) {
                                  *puVar15 = "bad huffman code";
                                  iVar34 = 1;
                                }
                                else {
                                  uVar37 = uVar35 >> 4;
                                  uVar22 = uVar35 & 0xf;
                                  if (uVar22 != 0) {
                                    lVar17 = (long)iVar34 + (ulong)uVar37;
                                    bVar2 = ""[lVar17];
                                    if (z->code_bits < (int)uVar22) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    uVar37 = z->code_buffer;
                                    uVar20 = uVar37 << (sbyte)uVar22 |
                                             uVar37 >> 0x20 - (sbyte)uVar22;
                                    uVar35 = *(uint *)((long)stbi__bmask + (ulong)(uVar22 * 4));
                                    z->code_buffer = ~uVar35 & uVar20;
                                    z->code_bits = z->code_bits - uVar22;
                                    iVar34 = 0;
                                    iVar16 = 0;
                                    if (-1 < (int)uVar37) {
                                      iVar16 = *(int *)((long)stbi__jbias + (ulong)(uVar22 * 4));
                                    }
                                    iVar16 = (uVar20 & uVar35) + iVar16 << (bVar5 & 0x1f);
                                    uVar30 = (ulong)((int)lVar17 + 1);
                                    psVar31[bVar2] = (short)iVar16;
                                    uVar39 = CONCAT71((uint7)(uint3)((uint)iVar16 >> 8),1);
                                    goto LAB_001baf12;
                                  }
                                  if (0xef < uVar35) {
                                    uVar35 = iVar34 + 0x10;
                                    goto LAB_001bacc5;
                                  }
                                  z->eob_run = 1 << ((byte)uVar37 & 0x1f);
                                  if (0xf < uVar35) {
                                    if (z->code_bits < (int)uVar37) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    bVar2 = (byte)uVar37 & 0x1f;
                                    uVar22 = z->code_buffer << bVar2 |
                                             z->code_buffer >> 0x20 - bVar2;
                                    uVar35 = stbi__bmask[uVar37];
                                    z->code_buffer = ~uVar35 & uVar22;
                                    z->code_bits = z->code_bits - uVar37;
                                    z->eob_run = z->eob_run + (uVar22 & uVar35);
                                  }
                                  z->eob_run = z->eob_run + -1;
                                  iVar34 = 2;
                                }
                                uVar39 = 0;
                              }
                              else {
                                z->code_buffer = z->code_buffer << (sbyte)(uVar37 & 0xf);
                                uVar12 = (ulong)(uVar37 >> 4 & 0xf);
                                z->code_bits = z->code_bits - (uVar37 & 0xf);
                                uVar35 = (int)((long)iVar34 + uVar12) + 1;
                                psVar31[""[(long)iVar34 + uVar12]] =
                                     (short)((uVar37 >> 8) << (bVar5 & 0x1f));
LAB_001bacc5:
                                uVar30 = (ulong)uVar35;
                                iVar34 = 0;
                                uVar39 = CONCAT71((int7)(uVar12 >> 8),1);
                              }
LAB_001baf12:
                              bVar42 = false;
                              uVar12 = 1;
                              if (iVar34 != 0) {
                                bVar42 = false;
                                if (iVar34 != 2) {
                                  uVar12 = uVar39;
                                  bVar42 = false;
                                }
                                break;
                              }
                            } while ((int)uVar30 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar34 + -1;
                            uVar12 = 0;
                            bVar42 = true;
                          }
                          if ((char)uVar12 != '\0') goto LAB_001bab2c;
                        }
                        else {
                          if (iVar34 == 0) {
                            uVar37 = (0x10000 << (bVar5 & 0x1f)) >> 0x10;
                            local_108 = psVar41;
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar35 = z->code_buffer;
                              uVar39 = (ulong)uVar35;
                              uVar12 = (ulong)psVar41->fast[uVar35 >> 0x17];
                              if (uVar12 == 0xff) {
                                lVar17 = 0;
                                do {
                                  lVar33 = lVar17;
                                  lVar17 = lVar33 + 1;
                                } while ((uint)piVar4[lVar11 * 0x1a4 + lVar33 + -0x11] <=
                                         uVar35 >> 0x10);
                                iVar34 = z->code_bits;
                                if (lVar17 == 8) {
                                  z->code_bits = iVar34 + -0x10;
                                  uVar22 = 0xffffffff;
                                }
                                else {
                                  uVar22 = 0xffffffff;
                                  if ((int)(lVar33 + 10) <= iVar34) {
                                    uVar22 = stbi__bmask[lVar33 + 10];
                                    iVar16 = piVar4[lVar11 * 0x1a4 + lVar17];
                                    uVar20 = uVar35 << ((byte)(lVar33 + 10) & 0x1f);
                                    z->code_bits = (iVar34 - (int)lVar17) + -9;
                                    z->code_buffer = uVar20;
                                    uVar12 = (ulong)(int)((uVar35 >> (0x17U - (char)lVar17 & 0x1f) &
                                                          uVar22) + iVar16);
                                    goto LAB_001ba924;
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar41->size[uVar12];
                                uVar22 = 0xffffffff;
                                if ((int)(uint)bVar2 <= z->code_bits) {
                                  uVar20 = uVar35 << (bVar2 & 0x1f);
                                  z->code_buffer = uVar20;
                                  z->code_bits = z->code_bits - (uint)bVar2;
LAB_001ba924:
                                  uVar39 = (ulong)uVar20;
                                  uVar22 = (uint)psVar41->values[uVar12];
                                }
                              }
                              if ((int)uVar22 < 0) {
                                *puVar15 = "bad huffman code";
                                bVar42 = false;
                              }
                              else {
                                uVar35 = uVar22 >> 4;
                                if ((uVar22 & 0xf) == 1) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                    uVar39 = extraout_RDX_05;
                                  }
                                  uVar22 = z->code_buffer;
                                  z->code_buffer = uVar22 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  sVar40 = (short)(((int)~uVar22 >> 0x1f | 1U) << (bVar5 & 0x1f));
                                }
                                else {
                                  if ((uVar22 & 0xf) != 0) {
                                    *puVar15 = "bad huffman code";
                                    bVar42 = false;
                                    goto LAB_001bab16;
                                  }
                                  if (uVar22 < 0xf0) {
                                    z->eob_run = ~(-1 << ((byte)uVar35 & 0x1f));
                                    if (0xf < uVar22) {
                                      if (z->code_bits < (int)uVar35) {
                                        stbi__grow_buffer_unsafe(z);
                                      }
                                      bVar2 = (byte)uVar35 & 0x1f;
                                      uVar20 = z->code_buffer << bVar2 |
                                               z->code_buffer >> 0x20 - bVar2;
                                      uVar22 = stbi__bmask[uVar35];
                                      uVar21 = ~uVar22 & uVar20;
                                      uVar39 = (ulong)uVar21;
                                      z->code_buffer = uVar21;
                                      z->code_bits = z->code_bits - uVar35;
                                      z->eob_run = z->eob_run + (uVar20 & uVar22);
                                    }
                                    sVar40 = 0;
                                    uVar35 = 0x40;
                                  }
                                  else {
                                    sVar40 = 0;
                                    uVar35 = 0xf;
                                  }
                                }
                                uVar30 = (ulong)(int)uVar30;
                                do {
                                  if ((long)z->spec_end < (long)uVar30) break;
                                  bVar2 = ""[uVar30];
                                  if (psVar31[bVar2] == 0) {
                                    if (uVar35 == 0) {
                                      psVar31[bVar2] = sVar40;
                                      bVar42 = false;
                                      uVar35 = 0;
                                    }
                                    else {
                                      uVar35 = uVar35 - 1;
                                      bVar42 = true;
                                    }
                                  }
                                  else {
                                    if (z->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(z);
                                      uVar39 = extraout_RDX_06;
                                    }
                                    sVar8 = z->code_buffer;
                                    z->code_buffer = sVar8 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    bVar42 = true;
                                    if (((int)sVar8 < 0) &&
                                       (sVar3 = psVar31[bVar2], (uVar37 & (int)sVar3) == 0)) {
                                      uVar22 = uVar37;
                                      if (sVar3 < 1) {
                                        uVar22 = -uVar37;
                                      }
                                      psVar31[bVar2] = sVar3 + (short)uVar22;
                                    }
                                  }
                                  uVar30 = uVar30 + 1;
                                } while (bVar42);
                                bVar42 = true;
                                psVar41 = local_108;
                              }
LAB_001bab16:
                              if (!bVar42) {
                                bVar42 = false;
                                goto LAB_001bab31;
                              }
                            } while ((int)uVar30 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar34 + -1;
                            if (z->spec_start <= z->spec_end) {
                              uVar37 = (0x10000 << (bVar5 & 0x1f)) >> 0x10;
                              do {
                                bVar5 = ""[uVar30];
                                if (psVar31[bVar5] != 0) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                    uVar39 = extraout_RDX_03;
                                  }
                                  sVar8 = z->code_buffer;
                                  z->code_buffer = sVar8 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if (((int)sVar8 < 0) &&
                                     (sVar40 = psVar31[bVar5], (uVar37 & (int)sVar40) == 0)) {
                                    uVar35 = -uVar37;
                                    if (0 < sVar40) {
                                      uVar35 = uVar37;
                                    }
                                    psVar31[bVar5] = (short)uVar35 + sVar40;
                                  }
                                }
                                bVar42 = (long)uVar30 < (long)z->spec_end;
                                uVar30 = uVar30 + 1;
                              } while (bVar42);
                            }
                          }
LAB_001bab2c:
                          bVar42 = true;
                        }
LAB_001bab31:
                        if (!bVar42) {
                          local_190._0_4_ = 0;
                        }
                        local_190 = (ulong)(uint)local_190;
                        paVar23 = local_128;
                        if (!bVar42) {
                          bVar42 = false;
                        }
                        else {
LAB_001bab57:
                          iVar34 = z->todo;
                          z->todo = iVar34 + -1;
                          bVar42 = true;
                          if (iVar34 < 2) {
                            if (z->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(z);
                              uVar39 = extraout_RDX_07;
                            }
                            if ((z->marker & 0xf8) == 0xd0) {
                              z->code_buffer = 0;
                              z->code_bits = 0;
                              z->nomore = 0;
                              z->img_comp[3].dc_pred = 0;
                              z->img_comp[2].dc_pred = 0;
                              z->img_comp[1].dc_pred = 0;
                              z->img_comp[0].dc_pred = 0;
                              z->marker = 0xff;
                              iVar34 = z->restart_interval;
                              uVar39 = 0x7fffffff;
                              if (iVar34 == 0) {
                                iVar34 = 0x7fffffff;
                              }
                              z->todo = iVar34;
                              z->eob_run = 0;
                            }
                            else {
                              local_190 = 1;
                              bVar42 = false;
                            }
                          }
                        }
                      }
                      uVar37 = (uint)uVar39;
                      if (!bVar42) {
                        iVar7 = (uint)local_190;
                        goto LAB_001bb5a4;
                      }
                      iVar7 = iVar7 + 1;
                    } while (iVar7 != local_138);
                  }
                  uVar37 = (uint)uVar39;
                  iVar7 = 1;
                  iVar38 = iVar38 + 1;
                } while (iVar38 != local_134);
              }
            }
            else {
              iVar7 = 1;
              if (0 < z->img_mcu_y) {
                iVar7 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    iVar38 = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar11 = 0;
                        do {
                          iVar34 = z->order[lVar11];
                          if (0 < z->img_comp[iVar34].v) {
                            iVar16 = 0;
                            bVar42 = true;
LAB_001bb1a6:
                            iVar9 = paVar1[iVar34].h;
                            if (iVar9 < 1) goto LAB_001bb206;
                            iVar36 = 0;
                            while( true ) {
                              iVar9 = stbi__jpeg_decode_block_prog_dc
                                                (z,paVar1[iVar34].coeff +
                                                   (iVar9 * iVar38 + iVar36 +
                                                   (paVar1[iVar34].v * iVar7 + iVar16) *
                                                   paVar1[iVar34].coeff_w) * 0x40,
                                                 z->huff_dc + paVar1[iVar34].hd,iVar34);
                              uVar37 = (uint)extraout_RDX_11;
                              uVar39 = extraout_RDX_11;
                              if (iVar9 == 0) break;
                              iVar36 = iVar36 + 1;
                              iVar9 = paVar1[iVar34].h;
                              if (iVar9 <= iVar36) goto LAB_001bb206;
                            }
                            if (!bVar42) goto LAB_001bb21e;
LAB_001bb589:
                            iVar7 = 0;
                            goto LAB_001bb5a4;
                          }
LAB_001bb21e:
                          lVar11 = lVar11 + 1;
                        } while (lVar11 < z->scan_n);
                      }
                      uVar37 = (uint)uVar39;
                      iVar34 = z->todo;
                      z->todo = iVar34 + -1;
                      if (iVar34 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar37 = extraout_EDX_01;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_001bb304;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar34 = z->restart_interval;
                        uVar39 = 0x7fffffff;
                        if (iVar34 == 0) {
                          iVar34 = 0x7fffffff;
                        }
                        z->todo = iVar34;
                        z->eob_run = 0;
                      }
                      iVar38 = iVar38 + 1;
                    } while (iVar38 < z->img_mcu_x);
                  }
                  uVar37 = (uint)uVar39;
                  iVar7 = iVar7 + 1;
                } while (iVar7 < z->img_mcu_y);
                goto LAB_001bb304;
              }
            }
LAB_001bb5a4:
            if (iVar7 != 0) {
              if (z->marker != 0xff) goto LAB_001bb5b8;
LAB_001bb5c8:
              do {
                psVar26 = z->s;
                if ((psVar26->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001bb5e4:
                  if (psVar26->img_buffer_end <= psVar26->img_buffer) goto LAB_001bb5b8;
                }
                else {
                  iVar7 = (*(psVar26->io).eof)(psVar26->io_user_data);
                  if (iVar7 != 0) {
                    if (psVar26->read_from_callbacks != 0) goto LAB_001bb5e4;
                    goto LAB_001bb5b8;
                  }
                }
                psVar26 = z->s;
                psVar25 = psVar26->img_buffer;
                if (psVar26->img_buffer_end <= psVar25) {
                  if (psVar26->read_from_callbacks == 0) goto LAB_001bb5c8;
                  stbi__refill_buffer(psVar26);
                  psVar25 = psVar26->img_buffer;
                }
                psVar26->img_buffer = psVar25 + 1;
              } while (*psVar25 != 0xff);
              psVar26 = z->s;
              psVar25 = psVar26->img_buffer;
              if (psVar25 < psVar26->img_buffer_end) {
LAB_001bb658:
                psVar26->img_buffer = psVar25 + 1;
                sVar6 = *psVar25;
              }
              else {
                if (psVar26->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar26);
                  psVar25 = psVar26->img_buffer;
                  goto LAB_001bb658;
                }
                sVar6 = '\0';
              }
              z->marker = sVar6;
              goto LAB_001bb5b8;
            }
            goto LAB_001bc05d;
          }
          pcVar19 = "bad SOS len";
        }
LAB_001bc055:
        uVar37 = (uint)paVar23;
        *puVar15 = pcVar19;
      }
LAB_001bc05d:
      uVar35 = z->s->img_n;
LAB_001bc064:
      stbi__free_jpeg_components(z,uVar35,uVar37);
    }
    else {
      *(char **)(*in_FS_OFFSET + -0x20) = "bad req_comp";
    }
LAB_001bc06c:
    pvVar13 = (void *)0x0;
LAB_001bc06e:
    free(z);
  }
  return pvVar13;
LAB_001bb206:
  iVar16 = iVar16 + 1;
  bVar42 = iVar16 < paVar1[iVar34].v;
  if (paVar1[iVar34].v <= iVar16) goto LAB_001bb21e;
  goto LAB_001bb1a6;
LAB_001bb5b8:
  bVar5 = stbi__get_marker(z);
  uVar24 = extraout_RDX_14;
  goto LAB_001ba26c;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}